

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_type_raw_validate(coda_type_raw *type)

{
  ulong uVar1;
  char *message;
  long a;
  char s [21];
  
  if (type == (coda_type_raw *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x866);
  }
  else {
    if (((type->format < coda_format_xml) && (type->size_expr == (coda_expression *)0x0)) &&
       (type->bit_size < 0)) {
      message = "missing bit size or bit size expression for raw type";
    }
    else {
      if (type->fixed_value == (char *)0x0) {
        return 0;
      }
      uVar1 = type->bit_size;
      if (-1 < (long)uVar1) {
        a = ((uVar1 >> 3) + 1) - (ulong)((uVar1 & 7) == 0);
        if (a != type->fixed_value_length) {
          coda_str64(a,s);
          coda_set_error(-400,
                         "length of fixed value (%ld) should equal rounded byte size (%s) for raw type"
                         ,type->fixed_value_length,s);
          return -1;
        }
        return 0;
      }
      message = "bit size for raw type should be fixed if a fixed value is provided";
    }
    coda_set_error(-400,message);
  }
  return -1;
}

Assistant:

int coda_type_raw_validate(const coda_type_raw *type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->format == coda_format_ascii || type->format == coda_format_binary)
    {
        if (type->size_expr == NULL && type->bit_size < 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "missing bit size or bit size expression for raw type");
            return -1;
        }
    }

    if (type->fixed_value != NULL)
    {
        int64_t byte_size;

        if (type->bit_size < 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION,
                           "bit size for raw type should be fixed if a fixed value is provided");
            return -1;
        }

        /* if there is a fixed_value its length should equal the byte size of the data element */
        byte_size = (type->bit_size >> 3) + (type->bit_size & 0x7 ? 1 : 0);
        if (byte_size != type->fixed_value_length)
        {
            char s[21];

            coda_str64(byte_size, s);
            coda_set_error(CODA_ERROR_DATA_DEFINITION,
                           "length of fixed value (%ld) should equal rounded byte size (%s) for raw type",
                           type->fixed_value_length, s);
            return -1;
        }
    }
    return 0;
}